

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mutex.cpp
# Opt level: O1

HT_ErrorCode ht_mutex_unlock(HT_Mutex *mtx)

{
  if (mtx != (HT_Mutex *)0x0) {
    pthread_mutex_unlock((pthread_mutex_t *)mtx);
    return HT_ERR_OK;
  }
  __assert_fail("mtx",
                "/workspace/llm4binary/github/license_c_cmakelists/amzn[P]hawktracer/lib/mutex.cpp",
                0x9e,"HT_ErrorCode ht_mutex_unlock(HT_Mutex *)");
}

Assistant:

HT_ErrorCode
ht_mutex_unlock(HT_Mutex* mtx)
{
    assert(mtx);

#ifdef HT_MUTEX_IMPL_CPP11
    mtx->mtx.unlock();
    return HT_ERR_OK;
#elif defined(HT_MUTEX_IMPL_POSIX)
    return pthread_mutex_unlock(&mtx->mtx) == 0 ? HT_ERR_OK : HT_ERR_UNKNOWN;
#elif defined(HT_MUTEX_IMPL_WIN32)
    return ReleaseMutex(mtx->mtx) == 0 ? HT_ERR_OK : HT_ERR_UNKNOWN;
#endif
}